

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile.c
# Opt level: O3

int big_block_read(BigBlock *bb,BigBlockPtr *ptr,BigArray *array)

{
  uint uVar1;
  long lVar2;
  size_t sVar3;
  int iVar4;
  void *buf;
  ulong uVar5;
  ulong uVar6;
  FILE *__stream;
  size_t sVar7;
  int *piVar8;
  ulong __size;
  char *pcVar9;
  uint uVar10;
  ulong __n;
  char *pcVar11;
  char *msg;
  ulong uVar12;
  size_t dims [2];
  BigArray chunk_array;
  BigArrayIter array_iter;
  BigArrayIter chunk_iter;
  ulong local_498;
  long local_490;
  BigArray local_480;
  BigArrayIter local_260;
  BigArrayIter local_148;
  
  sVar3 = CHUNK_BYTES;
  buf = malloc(CHUNK_BYTES);
  uVar1 = bb->nmemb;
  local_490 = (long)(int)uVar1;
  uVar10 = 1;
  if (1 < uVar1) {
    uVar10 = uVar1;
  }
  _dtype_normalize((char *)&local_480,bb->dtype);
  iVar4 = atoi((char *)((long)&local_480.ndim + 2));
  __size = (ulong)(int)(iVar4 * uVar10);
  uVar5 = sVar3 / __size;
  memset(&local_480,0,0x220);
  local_498 = uVar5;
  if (buf == (void *)0x0) {
    _big_file_raise("Not enough memory for chunkbuf",
                    "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile.c"
                    ,0x333);
  }
  else {
    big_array_init(&local_480,buf,bb->dtype,2,&local_498,(ptrdiff_t *)0x0);
    big_array_iter_init(&local_260,array);
    uVar6 = array->size / (ulong)(long)(int)uVar10;
    uVar12 = (ulong)ptr->fileid;
    lVar2 = ptr->roffset;
    if (bb->size < bb->foffset[uVar12] + uVar6 + lVar2) {
      pcVar9 = bb->basename;
      pcVar11 = "Reading beyond the block `%s` at (%d:%td)";
      iVar4 = 0x33e;
LAB_00105107:
      _big_file_raise(pcVar11,
                      "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile.c"
                      ,iVar4,pcVar9,uVar12,lVar2 * __size);
    }
    else {
      do {
        if ((long)uVar6 < 1) {
LAB_00105270:
          free(buf);
          return 0;
        }
        uVar1 = ptr->fileid;
        lVar2 = ptr->roffset;
        if (bb->size <= bb->foffset[(int)uVar1] + lVar2) goto LAB_00105270;
        uVar12 = bb->fsize[(int)uVar1] - lVar2;
        if (uVar5 < uVar12) {
          uVar12 = uVar5;
        }
        __n = uVar6;
        if (uVar12 < uVar6) {
          __n = uVar12;
        }
        if (uVar12 == 0) {
          pcVar9 = bb->basename;
          pcVar11 = "Insufficient number of items in file `%s\' at (%d:%td)";
          iVar4 = 0x34d;
          uVar12 = (ulong)uVar1;
          goto LAB_00105107;
        }
        big_array_iter_init(&local_148,&local_480);
        __stream = (FILE *)_big_file_open_a_file(bb->basename,uVar1,"r",1);
        if (__stream == (FILE *)0x0) {
          iVar4 = 0x355;
          goto LAB_0010535d;
        }
        iVar4 = fseek(__stream,ptr->roffset * __size,0);
        if (iVar4 < 0) {
          pcVar9 = bb->basename;
          uVar1 = ptr->fileid;
          lVar2 = ptr->roffset;
          piVar8 = __errno_location();
          pcVar11 = strerror(*piVar8);
          msg = "Failed to seek in block `%s\' at (%d:%td) (%s)";
          iVar4 = 0x359;
LAB_0010533e:
          _big_file_raise(msg,
                          "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile.c"
                          ,iVar4,pcVar9,(ulong)uVar1,__size * lVar2,pcVar11);
          fclose(__stream);
          goto LAB_00105364;
        }
        sVar7 = fread(buf,__size,__n,__stream);
        if (__n != sVar7) {
          pcVar9 = bb->basename;
          uVar1 = ptr->fileid;
          lVar2 = ptr->roffset;
          piVar8 = __errno_location();
          pcVar11 = strerror(*piVar8);
          msg = "Failed to read in block `%s\' at (%d:%td) (%s)";
          iVar4 = 0x35d;
          goto LAB_0010533e;
        }
        fclose(__stream);
        iVar4 = _dtype_convert(&local_260,&local_148,(long)bb->nmemb * __n);
        if (iVar4 != 0) {
          iVar4 = 0x363;
          goto LAB_0010535d;
        }
        uVar6 = uVar6 - __n;
        iVar4 = big_block_seek(bb,ptr,__n + bb->foffset[ptr->fileid] + ptr->roffset);
      } while (iVar4 == 0);
      iVar4 = 0x368;
LAB_0010535d:
      _big_file_raise((char *)0x0,
                      "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile.c"
                      ,iVar4);
    }
LAB_00105364:
    free(buf);
  }
  return -1;
}

Assistant:

int
big_block_read(BigBlock * bb, BigBlockPtr * ptr, BigArray * array)
{
    char * chunkbuf = malloc(CHUNK_BYTES);

    int nmemb = bb->nmemb ? bb->nmemb : 1;
    int felsize = big_file_dtype_itemsize(bb->dtype) * nmemb;
    size_t CHUNK_SIZE = CHUNK_BYTES / felsize;

    BigArray chunk_array = {0};
    size_t dims[2];
    dims[0] = CHUNK_SIZE;
    dims[1] = bb->nmemb;

    BigArrayIter chunk_iter;
    BigArrayIter array_iter;

    FILE * fp = NULL;
    ptrdiff_t toread = 0;

    RAISEIF(chunkbuf == NULL,
            ex_malloc,
            "Not enough memory for chunkbuf");

    big_array_init(&chunk_array, chunkbuf, bb->dtype, 2, dims, NULL);
    big_array_iter_init(&array_iter, array);

    toread = array->size / nmemb;

    ptrdiff_t abs = bb->foffset[ptr->fileid] + ptr->roffset + toread;
    RAISEIF(abs > bb->size,
                ex_eof,
                "Reading beyond the block `%s` at (%d:%td)",
                bb->basename, ptr->fileid, ptr->roffset * felsize);

    while(toread > 0 && ! big_block_eof(bb, ptr)) {
        size_t chunk_size = CHUNK_SIZE;
        /* remaining items in the file */
        if(chunk_size > bb->fsize[ptr->fileid] - ptr->roffset) {
            chunk_size = bb->fsize[ptr->fileid] - ptr->roffset;
        }
        /* remaining items to read */
        if(chunk_size > toread) {
            chunk_size = toread;
        }
        RAISEIF(chunk_size == 0,
            ex_insuf,
            "Insufficient number of items in file `%s' at (%d:%td)",
            bb->basename, ptr->fileid, ptr->roffset * felsize);

        /* read to the beginning of chunk */
        big_array_iter_init(&chunk_iter, &chunk_array);

        fp = _big_file_open_a_file(bb->basename, ptr->fileid, "r", 1);
        RAISEIF(fp == NULL,
                ex_open,
                NULL);
        RAISEIF(0 > fseek(fp, ptr->roffset * felsize, SEEK_SET),
                ex_seek,
                "Failed to seek in block `%s' at (%d:%td) (%s)", 
                bb->basename, ptr->fileid, ptr->roffset * felsize, strerror(errno));
        RAISEIF(chunk_size != fread(chunkbuf, felsize, chunk_size, fp),
                ex_read,
                "Failed to read in block `%s' at (%d:%td) (%s)",
                bb->basename, ptr->fileid, ptr->roffset * felsize, strerror(errno));
        fclose(fp);
        fp = NULL;

        /* now translate the data from chunkbuf to mptr */
        RAISEIF(0 != _dtype_convert(&array_iter, &chunk_iter, chunk_size * bb->nmemb),
            ex_convert, NULL);

        toread -= chunk_size;
        RAISEIF(0 != big_block_seek_rel(bb, ptr, chunk_size),
                ex_blockseek,
                NULL);
    }

    free(chunkbuf);
    return 0;
ex_read:
ex_seek:
    fclose(fp);
ex_insuf:
ex_convert:
ex_blockseek:
ex_open:
ex_eof:
    free(chunkbuf);
ex_malloc:
    return -1;
}